

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

void png_check_chunk_name(png_const_structrp png_ptr,png_uint_32 chunk_name)

{
  int iVar1;
  png_uint_32 cn;
  
  iVar1 = 4;
  while ((0xffffffc5 < (chunk_name & 0xff) - 0x7b && (5 < (chunk_name & 0xff) - 0x5b))) {
    chunk_name = chunk_name >> 8;
    iVar1 = iVar1 + -1;
    if (iVar1 == 0) {
      return;
    }
  }
  png_chunk_error(png_ptr,"invalid chunk type");
}

Assistant:

void /* PRIVATE */
png_check_chunk_name(png_const_structrp png_ptr, png_uint_32 chunk_name)
{
   int i;
   png_uint_32 cn=chunk_name;

   png_debug(1, "in png_check_chunk_name");

   for (i=1; i<=4; ++i)
   {
      int c = cn & 0xff;

      if (c < 65 || c > 122 || (c > 90 && c < 97))
         png_chunk_error(png_ptr, "invalid chunk type");

      cn >>= 8;
   }
}